

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalable_encoder.c
# Opt level: O1

void usage_exit(void)

{
  fprintf(_stderr,
          "Usage: %s <codec> <width> <height> <infile0> <infile1> <outfile> <frames to encode>\nSee comments in scalable_encoder.c for more information.\n"
          ,exec_name);
  exit(1);
}

Assistant:

void usage_exit(void) {
  fprintf(stderr,
          "Usage: %s <codec> <width> <height> <infile0> <infile1> "
          "<outfile> <frames to encode>\n"
          "See comments in scalable_encoder.c for more information.\n",
          exec_name);
  exit(EXIT_FAILURE);
}